

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_bcon_new(void)

{
  uint uVar1;
  int iVar2;
  int __fd;
  long lVar3;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  bool bVar7;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t *bcon;
  bson_t expected;
  uint local_1d0;
  uint local_1b4;
  uint local_1b0;
  undefined1 local_180 [4];
  uint local_17c;
  
  bson_init(local_180);
  bson_append_utf8(local_180,"hello",0xffffffff,"world");
  lVar3 = bcon_new(0,"hello","world");
  __buf = (void *)bson_get_data(lVar3);
  __buf_00 = (void *)bson_get_data(local_180);
  local_1b4 = 0xffffffff;
  bVar7 = true;
  if (local_17c == *(uint *)(lVar3 + 4)) {
    __s1 = (void *)bson_get_data(local_180);
    __s2 = (void *)bson_get_data(lVar3);
    iVar2 = memcmp(__s1,__s2,(ulong)local_17c);
    bVar7 = iVar2 != 0;
  }
  if (!bVar7) {
    bson_destroy(lVar3);
    bson_destroy(local_180);
    return;
  }
  uVar4 = bson_as_canonical_extended_json(lVar3,0);
  uVar5 = bson_as_canonical_extended_json(local_180,0);
  local_1b0 = 0;
  do {
    if (*(uint *)(lVar3 + 4) <= local_1b0 || local_17c <= local_1b0) {
LAB_00145dcd:
      if (local_1b4 == 0xffffffff) {
        if (*(uint *)(lVar3 + 4) < local_17c) {
          local_1d0 = local_17c;
        }
        else {
          local_1d0 = *(uint *)(lVar3 + 4);
        }
        local_1b4 = local_1d0 - 1;
      }
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_1b4,uVar4,uVar5);
      iVar2 = open("failure.bad.bson",0x42,0x1a0);
      __fd = open("failure.expected.bson",0x42,0x1a0);
      if (iVar2 == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x245,"test_bcon_new","fd1 != -1");
        abort();
      }
      if (__fd == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x245,"test_bcon_new","fd2 != -1");
        abort();
      }
      uVar1 = *(uint *)(lVar3 + 4);
      uVar6 = write(iVar2,__buf,(ulong)*(uint *)(lVar3 + 4));
      if (uVar1 != uVar6) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x245,"test_bcon_new","(bcon)->len == bson_write (fd1, bson_data, (bcon)->len)");
        abort();
      }
      uVar6 = write(__fd,__buf_00,(ulong)local_17c);
      if (local_17c != uVar6) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x245,"test_bcon_new",
                "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)");
        abort();
      }
      close(iVar2);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
              ,0x245,"test_bcon_new","0");
      abort();
    }
    if (*(char *)((long)__buf + (ulong)local_1b0) != *(char *)((long)__buf_00 + (ulong)local_1b0)) {
      local_1b4 = local_1b0;
      goto LAB_00145dcd;
    }
    local_1b0 = local_1b0 + 1;
  } while( true );
}

Assistant:

static void
test_bcon_new (void)
{
   bson_t expected;
   bson_t *bcon;

   bson_init (&expected);

   bson_append_utf8 (&expected, "hello", -1, "world", -1);
   bcon = BCON_NEW ("hello", "world");

   bson_eq_bson (bcon, &expected);

   bson_destroy (bcon);
   bson_destroy (&expected);
}